

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FIBase64ValueImpl::~FIBase64ValueImpl(FIBase64ValueImpl *this)

{
  FIBase64ValueImpl *this_local;
  
  (this->super_FIBase64Value).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__0107e6d8;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIBase64Value::~FIBase64Value(&this->super_FIBase64Value);
  return;
}

Assistant:

inline FIBase64ValueImpl(std::vector<uint8_t> &&value_): strValueValid(false) { value = std::move(value_); }